

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

Gia_Man_t *
Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  uint *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  Vec_Bit_t *pVVar5;
  int *__s;
  void *__s_00;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char *__assertion;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  size_t sVar27;
  uint local_68;
  uint local_58;
  
  Gia_ManCleanMark0(p);
  uVar24 = p->nRegs;
  if ((int)uVar24 < 1) {
    local_58 = 0;
  }
  else {
    uVar12 = 0;
    do {
      iVar26 = p->vCis->nSize;
      local_58 = (uint)uVar12;
      uVar16 = (iVar26 - uVar24) + local_58;
      if (((int)uVar16 < 0) || (iVar26 <= (int)uVar16)) goto LAB_005018e1;
      iVar26 = p->vCis->pArray[uVar16];
      lVar18 = (long)iVar26;
      if ((lVar18 < 0) || (p->nObjs <= iVar26)) goto LAB_005018c2;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      local_58 = local_58 + 1;
      *(ulong *)(pGVar3 + lVar18) =
           *(ulong *)(pGVar3 + lVar18) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar12 >> 5] >> ((byte)uVar12 & 0x1f) & 1) << 0x1e);
      uVar24 = p->nRegs;
      uVar12 = (ulong)local_58;
    } while ((int)local_58 < (int)uVar24);
  }
  iVar26 = (((int)uVar24 >> 5) + 1) - (uint)((uVar24 & 0x1f) == 0);
  pVVar5 = (Vec_Bit_t *)malloc(0x10);
  pVVar5->nCap = iVar26 * 0x20;
  if (iVar26 == 0) {
    sVar27 = 0;
    __s = (int *)0x0;
  }
  else {
    sVar27 = (long)iVar26 << 2;
    __s = (int *)malloc(sVar27);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar26 * 0x20;
  iVar26 = 0;
  memset(__s,0,sVar27);
  *pvInits = pVVar5;
  if (iFrEnd < 1) {
    if (iFrEnd != 0) {
      __assertion = "i == iFrEnd";
      pcVar6 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
      ;
      pcVar14 = 
      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)";
LAB_00501991:
      __assert_fail(__assertion,pcVar6,0x10b,pcVar14);
    }
  }
  else {
    do {
      if (iVar26 == iFrBeg) {
        pVVar13 = p->vCis;
        if (0 < (int)uVar24) {
          uVar16 = 0;
          do {
            uVar20 = (pVVar13->nSize - uVar24) + uVar16;
            if (((int)uVar20 < 0) || (pVVar13->nSize <= (int)uVar20)) goto LAB_005018e1;
            iVar9 = pVVar13->pArray[uVar20];
            if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_005018c2;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if ((p->pObjs[iVar9].field_0x3 & 0x40) != 0) {
              if ((*pvInits)->nSize <= (int)uVar16) goto LAB_005019d9;
              puVar1 = (uint *)((*pvInits)->pArray + (uVar16 >> 5));
              *puVar1 = *puVar1 | 1 << ((byte)uVar16 & 0x1f);
              uVar24 = p->nRegs;
            }
            uVar16 = uVar16 + 1;
          } while ((int)uVar16 < (int)uVar24);
        }
      }
      else {
        pVVar13 = p->vCis;
      }
      uVar12 = (ulong)(uint)pVVar13->nSize;
      if ((int)uVar24 < pVVar13->nSize) {
        lVar18 = 0;
        do {
          if ((int)uVar12 <= lVar18) goto LAB_005018e1;
          lVar25 = (long)pVVar13->pArray[lVar18];
          if ((lVar25 < 0) || (iVar9 = p->nObjs, iVar9 <= pVVar13->pArray[lVar18]))
          goto LAB_005018c2;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) {
            local_58 = local_58 + (int)lVar18;
            goto LAB_00500b75;
          }
          *(ulong *)(pGVar3 + lVar25) =
               *(ulong *)(pGVar3 + lVar25) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_58 + lVar18) >> 5] >>
                        ((byte)((ulong)local_58 + lVar18) & 0x1f) & 1) << 0x1e);
          lVar18 = lVar18 + 1;
          pVVar13 = p->vCis;
          uVar12 = (ulong)pVVar13->nSize;
        } while (lVar18 < (long)(uVar12 - (long)p->nRegs));
        local_58 = local_58 + (int)lVar18;
      }
      iVar9 = p->nObjs;
      if (0 < iVar9) {
LAB_00500b75:
        lVar18 = 0;
        lVar25 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar3->field_0x0 + lVar18);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            *(ulong *)(&pGVar3->field_0x0 + lVar18) =
                 uVar12 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar12 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3 + lVar18) >>
                          0x1e) & ((uint)(uVar12 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 +
                                           lVar18) >> 0x1e) & 1) << 0x1e);
            iVar9 = p->nObjs;
          }
          lVar25 = lVar25 + 1;
          lVar18 = lVar18 + 0xc;
        } while (lVar25 < iVar9);
      }
      pVVar13 = p->vCos;
      if (0 < pVVar13->nSize) {
        lVar18 = 0;
        do {
          iVar9 = pVVar13->pArray[lVar18];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_005018c2;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar9;
          uVar24 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar24 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar24 & 0x1fffffff))) & 0x40000000
                      );
          lVar18 = lVar18 + 1;
          pVVar13 = p->vCos;
        } while (lVar18 < pVVar13->nSize);
      }
      uVar24 = p->nRegs;
      if (0 < (int)uVar24) {
        iVar9 = 0;
        do {
          iVar11 = p->vCos->nSize;
          uVar16 = (iVar11 - uVar24) + iVar9;
          if (((int)uVar16 < 0) || (iVar11 <= (int)uVar16)) goto LAB_005018e1;
          iVar11 = p->vCos->pArray[uVar16];
          if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_005018c2;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar24 = (iVar2 - uVar24) + iVar9;
          if (((int)uVar24 < 0) || (iVar2 <= (int)uVar24)) goto LAB_005018e1;
          uVar24 = p->vCis->pArray[uVar24];
          lVar18 = (long)(int)uVar24;
          if ((lVar18 < 0) || ((uint)p->nObjs <= uVar24)) goto LAB_005018c2;
          *(ulong *)(pGVar3 + lVar18) =
               *(ulong *)(pGVar3 + lVar18) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar11) & 0x40000000);
          iVar9 = iVar9 + 1;
          uVar24 = p->nRegs;
        } while (iVar9 < (int)uVar24);
      }
      iVar26 = iVar26 + 1;
    } while (iVar26 != iFrEnd);
  }
  iVar26 = (((int)uVar24 >> 5) + 1) - (uint)((uVar24 & 0x1f) == 0);
  if (iVar26 == 0) {
    sVar27 = 0;
    __s_00 = (void *)0x0;
  }
  else {
    sVar27 = (long)iVar26 << 2;
    __s_00 = malloc(sVar27);
  }
  uVar16 = iVar26 * 0x20;
  uVar20 = 0;
  memset(__s_00,0,sVar27);
  if (0 < (int)uVar24) {
    pVVar13 = p->vCis;
    iVar26 = pVVar13->nSize;
    do {
      uVar10 = (iVar26 - uVar24) + uVar20;
      if (((int)uVar10 < 0) || (iVar26 <= (int)uVar10)) goto LAB_005018e1;
      iVar9 = pVVar13->pArray[uVar10];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_005018c2;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->pObjs[iVar9].field_0x3 & 0x40) != 0) {
        if ((int)uVar16 <= (int)uVar20) {
LAB_005019d9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s_00 + (ulong)(uVar20 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar20 & 0x1f);
      }
      uVar20 = uVar20 + 1;
    } while (uVar24 != uVar20);
  }
  p_00 = Gia_ManStart(10000);
  pcVar14 = p->pName;
  if (pcVar14 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar27 = strlen(pcVar14);
    pcVar6 = (char *)malloc(sVar27 + 1);
    strcpy(pcVar6,pcVar14);
  }
  p_00->pName = pcVar6;
  iVar26 = p->nRegs;
  if (0 < iVar26) {
    iVar9 = 0;
    do {
      iVar11 = p->vCis->nSize;
      uVar24 = (iVar11 - iVar26) + iVar9;
      if (((int)uVar24 < 0) || (iVar11 <= (int)uVar24)) goto LAB_005018e1;
      iVar26 = p->vCis->pArray[uVar24];
      if ((iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_005018c2;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_0050193e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_0050193e;
      iVar9 = iVar9 + 1;
      iVar26 = p->nRegs;
    } while (iVar9 < iVar26);
  }
  Gia_ManHashStart(p_00);
  pGVar3 = p->pObjs;
  pGVar3->Value = 1;
  pVVar13 = p->vCis;
  uVar24 = pVVar13->nSize;
  uVar20 = uVar24 - p->nRegs;
  if (uVar20 != 0 && p->nRegs <= (int)uVar24) {
    uVar19 = 0;
    uVar12 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar12 = uVar19;
    }
    do {
      if (uVar12 == uVar19) goto LAB_005018e1;
      iVar26 = pVVar13->pArray[uVar19];
      if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_005018c2;
      pGVar3[iVar26].Value = 1;
      uVar19 = uVar19 + 1;
    } while (uVar20 != uVar19);
  }
  if (iFrEnd <= pCex->iFrame) {
    iVar26 = iFrEnd;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    do {
      uVar12 = (ulong)(uint)p->nRegs;
      if (0 < p->nRegs) {
        uVar24 = 0;
        do {
          iVar9 = p->vCis->nSize;
          uVar20 = (iVar9 - (int)uVar12) + uVar24;
          if (((int)uVar20 < 0) || (iVar9 <= (int)uVar20)) goto LAB_005018e1;
          iVar9 = p->vCis->pArray[uVar20];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_005018c2;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar16 == uVar24) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          pGVar3 = p->pObjs + iVar9;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((*(uint *)((long)__s_00 + (ulong)(uVar24 >> 5) * 4) >> ((byte)uVar24 & 0x1f)
                       & 1) << 0x1e);
          uVar24 = uVar24 + 1;
          uVar12 = (ulong)(uint)p->nRegs;
        } while ((int)uVar24 < p->nRegs);
      }
      local_68 = local_58;
      iVar9 = iFrEnd;
      if (iFrEnd < iVar26) {
        do {
          pVVar13 = p->vCis;
          uVar19 = (ulong)(uint)pVVar13->nSize;
          if ((int)uVar12 < pVVar13->nSize) {
            lVar18 = 0;
            do {
              if ((int)uVar19 <= lVar18) goto LAB_005018e1;
              lVar25 = (long)pVVar13->pArray[lVar18];
              if ((lVar25 < 0) || (iVar11 = p->nObjs, iVar11 <= pVVar13->pArray[lVar18]))
              goto LAB_005018c2;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) {
                local_68 = local_68 + (int)lVar18;
                goto LAB_00501159;
              }
              *(ulong *)(pGVar3 + lVar25) =
                   *(ulong *)(pGVar3 + lVar25) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar18) >> 5] >>
                            ((byte)((ulong)local_68 + lVar18) & 0x1f) & 1) << 0x1e);
              lVar18 = lVar18 + 1;
              pVVar13 = p->vCis;
              uVar19 = (ulong)pVVar13->nSize;
            } while (lVar18 < (long)(uVar19 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar18;
          }
          iVar11 = p->nObjs;
          if (0 < iVar11) {
LAB_00501159:
            lVar18 = 0;
            lVar25 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar12 = *(ulong *)(&pGVar3->field_0x0 + lVar18);
              if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
                *(ulong *)(&pGVar3->field_0x0 + lVar18) =
                     uVar12 & 0xffffffff3fffffff |
                     (ulong)((((uint)(uVar12 >> 0x3d) ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3 + lVar18)
                              >> 0x1e) &
                              ((uint)(uVar12 >> 0x1d) & 7 ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 + lVar18)
                              >> 0x1e) & 1) << 0x1e);
                iVar11 = p->nObjs;
              }
              lVar25 = lVar25 + 1;
              lVar18 = lVar18 + 0xc;
            } while (lVar25 < iVar11);
          }
          pVVar13 = p->vCos;
          if (0 < pVVar13->nSize) {
            lVar18 = 0;
            do {
              iVar11 = pVVar13->pArray[lVar18];
              if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_005018c2;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar11;
              uVar24 = (uint)*(ulong *)pGVar3;
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar24 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar24 & 0x1fffffff))) &
                          0x40000000);
              lVar18 = lVar18 + 1;
              pVVar13 = p->vCos;
            } while (lVar18 < pVVar13->nSize);
          }
          uVar12 = (ulong)(uint)p->nRegs;
          if (0 < p->nRegs) {
            iVar11 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar24 = (iVar2 - (int)uVar12) + iVar11;
              if (((int)uVar24 < 0) || (iVar2 <= (int)uVar24)) goto LAB_005018e1;
              iVar2 = p->vCos->pArray[uVar24];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005018c2;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar15 = p->vCis->nSize;
              uVar24 = (iVar15 - (int)uVar12) + iVar11;
              if (((int)uVar24 < 0) || (iVar15 <= (int)uVar24)) goto LAB_005018e1;
              uVar24 = p->vCis->pArray[uVar24];
              lVar18 = (long)(int)uVar24;
              if ((lVar18 < 0) || ((uint)p->nObjs <= uVar24)) goto LAB_005018c2;
              *(ulong *)(pGVar3 + lVar18) =
                   *(ulong *)(pGVar3 + lVar18) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              iVar11 = iVar11 + 1;
              uVar12 = (ulong)(uint)p->nRegs;
            } while (iVar11 < p->nRegs);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != iVar26);
      }
      if (0 < (int)uVar12) {
        pVVar13 = p->vCis;
        iVar9 = pVVar13->nSize;
        uVar19 = (ulong)(uint)(iVar9 - (int)uVar12);
        uVar22 = 0;
        do {
          if (((int)uVar19 < 0) || (iVar9 <= (int)uVar19)) goto LAB_005018e1;
          iVar11 = pVVar13->pArray[uVar19];
          if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_005018c2;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          lVar18 = (long)p_00->vCis->nSize;
          if (lVar18 - p_00->nRegs <= (long)uVar22) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a6,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          if (lVar18 <= (long)uVar22) goto LAB_005018e1;
          iVar2 = p_00->vCis->pArray[uVar22];
          if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_005018c2;
          pGVar3 = p_00->pObjs;
          pGVar7 = (Gia_Obj_t *)((ulong)(pGVar3 + iVar2) & 0xfffffffffffffffe);
          if ((pGVar7 < pGVar3) || (pGVar3 + (uint)p_00->nObjs <= pGVar7)) goto LAB_0050193e;
          iVar15 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2);
          if (iVar15 * -0x55555555 < 0) {
            __assertion = "Var >= 0 && !(c >> 1)";
            pcVar6 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
            ;
            pcVar14 = "int Abc_Var2Lit(int, int)";
            goto LAB_00501991;
          }
          pGVar7 = p->pObjs + iVar11;
          pGVar7->Value =
               (uint)((*(uint *)pGVar7 >> 0x1e & 1) == 0) ^
               ((uint)(pGVar3 + iVar2) & 1) + iVar15 * 0x55555556;
          uVar22 = uVar22 + 1;
          uVar19 = uVar19 + 1;
        } while (uVar12 != uVar22);
      }
      iVar9 = iVar26;
      if (iVar26 <= pCex->iFrame) {
        do {
          pVVar13 = p->vCis;
          uVar19 = (ulong)(uint)pVVar13->nSize;
          if ((int)uVar12 < pVVar13->nSize) {
            lVar18 = 0;
            do {
              if ((int)uVar19 <= lVar18) goto LAB_005018e1;
              lVar25 = (long)pVVar13->pArray[lVar18];
              if ((lVar25 < 0) || (iVar11 = p->nObjs, iVar11 <= pVVar13->pArray[lVar18]))
              goto LAB_005018c2;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) {
                local_68 = local_68 + (int)lVar18;
                goto LAB_00501529;
              }
              *(ulong *)(pGVar3 + lVar25) =
                   *(ulong *)(pGVar3 + lVar25) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar18) >> 5] >>
                            ((byte)((ulong)local_68 + lVar18) & 0x1f) & 1) << 0x1e);
              lVar18 = lVar18 + 1;
              pVVar13 = p->vCis;
              uVar19 = (ulong)pVVar13->nSize;
            } while (lVar18 < (long)(uVar19 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar18;
          }
          iVar11 = p->nObjs;
          if (0 < iVar11) {
LAB_00501529:
            lVar25 = 8;
            lVar18 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar12 = *(ulong *)((long)pGVar3 + lVar25 + -8);
              if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
                uVar24 = (uint)(uVar12 & 0x1fffffff);
                uVar17 = (uint)(uVar12 >> 0x1d) & 7 ^
                         *(uint *)((long)pGVar3 + (ulong)(uVar24 * 4) * -3 + lVar25 + -8) >> 0x1e;
                uVar20 = (uint)(uVar12 >> 0x20);
                uVar10 = uVar20 & 0x1fffffff;
                uVar21 = *(uint *)((long)pGVar3 + (ulong)(uVar10 * 4) * -3 + lVar25 + -8) >> 0x1e &
                         1;
                uVar20 = uVar20 >> 0x1d & 1;
                uVar23 = (uVar21 ^ uVar20) & uVar17;
                *(ulong *)((long)pGVar3 + lVar25 + -8) =
                     uVar12 & 0xffffffff3fffffff | (ulong)(uVar23 << 0x1e);
                if (uVar23 == 0) {
                  if (((uVar17 & 1) == 0) && (uVar21 == uVar20)) {
                    iVar11 = Gia_ManHashOr(p_00,*(int *)((long)pGVar3 +
                                                        lVar25 + (ulong)(uVar24 << 2) * -3),
                                           *(int *)((long)pGVar3 +
                                                   lVar25 + (ulong)(uVar10 << 2) * -3));
                  }
                  else {
                    if (((uVar17 & 1) != 0) && (uVar24 = uVar10, uVar21 != uVar20)) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                                    ,0x144,
                                    "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                                   );
                    }
                    iVar11 = *(int *)((long)pGVar3 + lVar25 + (ulong)(uVar24 << 2) * -3);
                  }
                }
                else {
                  iVar11 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar3 +
                                                       lVar25 + (ulong)(uVar24 << 2) * -3),
                                          *(int *)((long)pGVar3 + lVar25 + (ulong)(uVar10 << 2) * -3
                                                  ));
                }
                *(int *)(&pGVar3->field_0x0 + lVar25) = iVar11;
                if (iVar11 == 0) {
                  __assert_fail("pObj->Value > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                                ,0x145,
                                "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                               );
                }
                iVar11 = p->nObjs;
              }
              lVar18 = lVar18 + 1;
              lVar25 = lVar25 + 0xc;
            } while (lVar18 < iVar11);
          }
          pVVar13 = p->vCos;
          if (0 < pVVar13->nSize) {
            lVar18 = 0;
            do {
              iVar11 = pVVar13->pArray[lVar18];
              if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_005018c2;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar11;
              uVar24 = (uint)*(ulong *)pGVar3;
              uVar12 = (ulong)(uVar24 & 0x1fffffff);
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar24 * 2 ^ *(uint *)(pGVar3 + -uVar12)) & 0x40000000);
              uVar24 = pGVar3[-uVar12].Value;
              pGVar3->Value = uVar24;
              if (uVar24 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                              ,0x14b,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
              lVar18 = lVar18 + 1;
              pVVar13 = p->vCos;
            } while (lVar18 < pVVar13->nSize);
          }
          iVar11 = pCex->iFrame;
          if (iVar9 == iVar11) break;
          uVar12 = (ulong)(uint)p->nRegs;
          if (0 < p->nRegs) {
            iVar11 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar24 = (iVar2 - (int)uVar12) + iVar11;
              if (((int)uVar24 < 0) || (iVar2 <= (int)uVar24)) goto LAB_005018e1;
              iVar2 = p->vCos->pArray[uVar24];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005018c2;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar15 = p->vCis->nSize;
              uVar24 = (iVar15 - (int)uVar12) + iVar11;
              if (((int)uVar24 < 0) || (iVar15 <= (int)uVar24)) goto LAB_005018e1;
              uVar24 = p->vCis->pArray[uVar24];
              lVar18 = (long)(int)uVar24;
              if ((lVar18 < 0) || ((uint)p->nObjs <= uVar24)) goto LAB_005018c2;
              *(ulong *)(pGVar3 + lVar18) =
                   *(ulong *)(pGVar3 + lVar18) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              pGVar3[lVar18].Value = pGVar3[iVar2].Value;
              iVar11 = iVar11 + 1;
              uVar12 = (ulong)(uint)p->nRegs;
            } while (iVar11 < p->nRegs);
            iVar11 = pCex->iFrame;
          }
          bVar4 = iVar9 < iVar11;
          iVar9 = iVar9 + 1;
        } while (bVar4);
      }
      if (local_68 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                      ,0x155,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      uVar24 = pCex->iPo;
      iVar9 = p->vCos->nSize;
      if (iVar9 - p->nRegs <= (int)uVar24) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar24 < 0) || (iVar9 <= (int)uVar24)) {
LAB_005018e1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = p->vCos->pArray[uVar24];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_005018c2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Gia_ManAppendCo(p_00,p->pObjs[iVar9].Value);
      bVar4 = iVar26 < pCex->iFrame;
      iVar26 = iVar26 + 1;
    } while (bVar4);
  }
  Gia_ManHashStop(p_00);
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllFrames( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vInitEnd;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, i, k, iBitOld, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );
    vInitEnd = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObjRo, k )
        if ( pObjRo->fMark0 )
            Vec_BitWriteEntry( vInitEnd, k, 1 );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObjRo, k )
        Gia_ManAppendCi(pNew);
    Gia_ManHashStart( pNew );

    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;

    iBitOld = iBit;
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
    {
        // set up correct init state
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->fMark0 = Vec_BitEntry( vInitEnd, k );
        // simulate it for a few frames
        iBit = iBitOld;
        for ( i = iFrEnd; i < f; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
                pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                               (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
            Gia_ManForEachCo( p, pObj, k )
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
                pObjRo->fMark0 = pObjRi->fMark0;
        }
        // start creating values
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->Value = Abc_LitNotCond( Gia_Obj2Lit(pNew, Gia_ManPi(pNew, k)), !pObjRo->fMark0 );
        for ( i = f; i <= pCex->iFrame; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 && !fCompl1 )
                    pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 )
                    pObj->Value = Gia_ObjFanin0(pObj)->Value;
                else if ( !fCompl1 )
                    pObj->Value = Gia_ObjFanin1(pObj)->Value;
                else assert( 0 );
                assert( pObj->Value > 0 );
            }
            Gia_ManForEachCo( p, pObj, k )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
                assert( pObj->Value > 0 );
            } 
            if ( i == pCex->iFrame )
                break;
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            {
                pObjRo->fMark0 = pObjRi->fMark0;
                pObjRo->Value = pObjRi->Value;
            }
        }
        assert( iBit == pCex->nBits );
        // create PO
        Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    }
    Gia_ManHashStop( pNew );
    Vec_BitFree( vInitEnd );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}